

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Matchers::Generic::PredicateMatcher<duckdb_interval>::describe_abi_cxx11_
          (PredicateMatcher<duckdb_interval> *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x50));
  return in_RDI;
}

Assistant:

std::string describe() const override {
        return m_description;
    }